

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base.cpp
# Opt level: O1

bool __thiscall BaseIndex::Commit(BaseIndex *this)

{
  uint256 *puVar1;
  string_view source_file;
  bool bVar2;
  int iVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  Logger *pLVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_R8;
  long in_FS_OFFSET;
  char cVar5;
  string_view str;
  string_view logging_function;
  CDBBatch batch;
  undefined1 local_110 [16];
  CDBWrapper local_100;
  CBlockLocator local_78;
  string local_58;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  cVar5 = (this->m_best_block_index)._M_b._M_p != (__pointer_type)0x0;
  if ((bool)cVar5) {
    iVar3 = (*(this->super_CValidationInterface)._vptr_CValidationInterface[0xf])(this);
    CDBBatch::CDBBatch((CDBBatch *)local_110,(CDBWrapper *)CONCAT44(extraout_var,iVar3));
    iVar3 = (*(this->super_CValidationInterface)._vptr_CValidationInterface[0xd])
                      (this,(CDBBatch *)local_110);
    cVar5 = (char)iVar3;
    if (cVar5 != '\0') {
      (*(this->super_CValidationInterface)._vptr_CValidationInterface[0xf])(this);
      puVar1 = ((this->m_best_block_index)._M_b._M_p)->phashBlock;
      if (puVar1 == (uint256 *)0x0) {
        __assert_fail("phashBlock != nullptr",
                      "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/chain.h"
                      ,0xf5,"uint256 CBlockIndex::GetBlockHash() const");
      }
      local_58._M_dataplus._M_p = *(pointer *)(puVar1->super_base_blob<256U>).m_data._M_elems;
      local_58._M_string_length =
           *(size_type *)((puVar1->super_base_blob<256U>).m_data._M_elems + 8);
      local_58.field_2._M_allocated_capacity =
           *(undefined8 *)((puVar1->super_base_blob<256U>).m_data._M_elems + 0x10);
      local_58.field_2._8_8_ =
           *(undefined8 *)((puVar1->super_base_blob<256U>).m_data._M_elems + 0x18);
      GetLocator(&local_78,
                 (this->m_chain)._M_t.
                 super___uniq_ptr_impl<interfaces::Chain,_std::default_delete<interfaces::Chain>_>.
                 _M_t.
                 super__Tuple_impl<0UL,_interfaces::Chain_*,_std::default_delete<interfaces::Chain>_>
                 .super__Head_base<0UL,_interfaces::Chain_*,_false>._M_head_impl,
                 (uint256 *)&local_58);
      CDBBatch::Write<unsigned_char,CBlockLocator>((CDBBatch *)local_110,"B9BaseIndex",&local_78);
      if (local_78.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_78.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl
                        .super__Vector_impl_data._M_start,
                        (long)local_78.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_78.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
      iVar3 = (*(this->super_CValidationInterface)._vptr_CValidationInterface[0xf])(this);
      cVar5 = CDBWrapper::WriteBatch
                        ((CDBWrapper *)CONCAT44(extraout_var_00,iVar3),(CDBBatch *)local_110,false);
    }
    CDBBatch::~CDBBatch((CDBBatch *)local_110);
  }
  if (cVar5 == '\0') {
    pLVar4 = LogInstance();
    bVar2 = BCLog::Logger::Enabled(pLVar4);
    if (bVar2) {
      local_110._8_8_ =
           (__uniq_ptr_impl<CDBBatch::WriteBatchImpl,_std::default_delete<CDBBatch::WriteBatchImpl>_>
            )0x0;
      local_100.m_db_context._M_t.
      super___uniq_ptr_impl<LevelDBContext,_std::default_delete<LevelDBContext>_>._M_t.
      super__Tuple_impl<0UL,_LevelDBContext_*,_std::default_delete<LevelDBContext>_>.
      super__Head_base<0UL,_LevelDBContext_*,_false>._M_head_impl._0_1_ = '\0';
      local_110._0_8_ = &local_100;
      tinyformat::format<char[7],std::__cxx11::string>
                (&local_58,(tinyformat *)"%s: Failed to commit latest %s state\n","Commit",
                 (char (*) [7])&this->m_name,in_R8);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_110,
                 &local_58);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_58._M_dataplus._M_p != &local_58.field_2) {
        operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
      }
      pLVar4 = LogInstance();
      local_58._M_dataplus._M_p = (pointer)0x57;
      local_58._M_string_length = 0x855b83;
      source_file._M_str =
           "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/index/base.cpp"
      ;
      source_file._M_len = 0x57;
      str._M_str = (char *)local_110._0_8_;
      str._M_len = local_110._8_8_;
      logging_function._M_str = "Commit";
      logging_function._M_len = 6;
      BCLog::Logger::LogPrintStr(pLVar4,str,logging_function,source_file,0xf0,ALL,Error);
      if ((CDBWrapper *)local_110._0_8_ != &local_100) {
        operator_delete((void *)local_110._0_8_,
                        CONCAT71(local_100.m_db_context._M_t.
                                 super___uniq_ptr_impl<LevelDBContext,_std::default_delete<LevelDBContext>_>
                                 ._M_t.
                                 super__Tuple_impl<0UL,_LevelDBContext_*,_std::default_delete<LevelDBContext>_>
                                 .super__Head_base<0UL,_LevelDBContext_*,_false>._M_head_impl._1_7_,
                                 local_100.m_db_context._M_t.
                                 super___uniq_ptr_impl<LevelDBContext,_std::default_delete<LevelDBContext>_>
                                 ._M_t.
                                 super__Tuple_impl<0UL,_LevelDBContext_*,_std::default_delete<LevelDBContext>_>
                                 .super__Head_base<0UL,_LevelDBContext_*,_false>._M_head_impl._0_1_)
                        + 1);
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return (bool)cVar5;
  }
  __stack_chk_fail();
}

Assistant:

bool BaseIndex::Commit()
{
    // Don't commit anything if we haven't indexed any block yet
    // (this could happen if init is interrupted).
    bool ok = m_best_block_index != nullptr;
    if (ok) {
        CDBBatch batch(GetDB());
        ok = CustomCommit(batch);
        if (ok) {
            GetDB().WriteBestBlock(batch, GetLocator(*m_chain, m_best_block_index.load()->GetBlockHash()));
            ok = GetDB().WriteBatch(batch);
        }
    }
    if (!ok) {
        LogError("%s: Failed to commit latest %s state\n", __func__, GetName());
        return false;
    }
    return true;
}